

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_test.cpp
# Opt level: O1

void flatbuffers::tests::proto_test_union_suffix_id(string *proto_path,string *proto_file)

{
  pointer pcVar1;
  bool expval;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string golden_file;
  IDLOptions opts;
  long *local_390 [2];
  long local_380 [2];
  string local_370;
  string local_350;
  IDLOptions local_330;
  
  IDLOptions::IDLOptions(&local_330);
  local_330.include_dependence_headers = false;
  local_330.proto_mode = true;
  std::__cxx11::string::_M_replace
            ((ulong)&local_330.proto_namespace_suffix,0,
             (char *)local_330.proto_namespace_suffix._M_string_length,0x1cb6aa);
  local_330.proto_oneof_union = true;
  local_330.keep_proto_id = true;
  local_330.proto_id_gap_action = NO_OP;
  local_370._M_string_length = 0;
  local_370.field_2._M_local_buf[0] = '\0';
  pcVar1 = (proto_path->_M_dataplus)._M_p;
  local_390[0] = local_380;
  local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_390,pcVar1,pcVar1 + proto_path->_M_string_length);
  std::__cxx11::string::append((char *)local_390);
  expval = LoadFile((char *)local_390[0],false,&local_370);
  TestEq<bool,bool>(expval,true,
                    "\'flatbuffers::LoadFile( (proto_path + \"test_union_suffix_id.golden.fbs\").c_str(), false, &golden_file)\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/proto_test.cpp"
                    ,0x94,"");
  if (local_390[0] != local_380) {
    operator_delete(local_390[0],local_380[0] + 1);
  }
  local_350._M_string_length = 0;
  local_350.field_2._M_local_buf[0] = '\0';
  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
  RunTest(&local_330,proto_path,proto_file,&local_370,&local_350);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p,
                    CONCAT71(local_350.field_2._M_allocated_capacity._1_7_,
                             local_350.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p,
                    CONCAT71(local_370.field_2._M_allocated_capacity._1_7_,
                             local_370.field_2._M_local_buf[0]) + 1);
  }
  IDLOptions::~IDLOptions(&local_330);
  return;
}

Assistant:

void proto_test_union_suffix_id(const std::string &proto_path,
                                const std::string &proto_file) {
  flatbuffers::IDLOptions opts;
  opts.include_dependence_headers = false;
  opts.proto_mode = true;
  opts.proto_namespace_suffix = "test_namespace_suffix";
  opts.proto_oneof_union = true;
  opts.keep_proto_id = true;
  opts.proto_id_gap_action = IDLOptions::ProtoIdGapAction::NO_OP;

  std::string golden_file;
  TEST_EQ(flatbuffers::LoadFile(
              (proto_path + "test_union_suffix_id.golden.fbs").c_str(), false,
              &golden_file),
          true);
  RunTest(opts, proto_path, proto_file, golden_file);
}